

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_Xform>::Append(ON_SimpleArray<ON_Xform> *this,int count,ON_Xform *buffer)

{
  uint uVar1;
  uint uVar2;
  ON_Xform *__dest;
  uint uVar3;
  uint uVar4;
  size_t __n;
  
  if (buffer != (ON_Xform *)0x0 && 0 < count) {
    __n = (ulong)(uint)count << 7;
    uVar1 = this->m_count;
    uVar4 = uVar1 + count;
    uVar2 = this->m_capacity;
    if ((int)uVar2 < (int)uVar4) {
      if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 << 7) < 0x10000001)) {
        uVar3 = 4;
        if (2 < (int)uVar1) {
          uVar3 = uVar1 * 2;
        }
      }
      else {
        uVar3 = 0x200008;
        if (uVar1 < 0x200008) {
          uVar3 = uVar1;
        }
        uVar3 = uVar3 + uVar1;
      }
      if ((int)uVar4 < (int)uVar3) {
        uVar4 = uVar3;
      }
      if (buffer < this->m_a + (int)uVar2 && this->m_a <= buffer) {
        __dest = (ON_Xform *)onmalloc(__n);
        memcpy(__dest,buffer,__n);
        uVar2 = this->m_capacity;
        buffer = __dest;
      }
      else {
        __dest = (ON_Xform *)0x0;
      }
      if (uVar2 < uVar4) {
        SetCapacity(this,(long)(int)uVar4);
      }
      memcpy(this->m_a + this->m_count,buffer,__n);
      if (__dest != (ON_Xform *)0x0) {
        onfree(__dest);
      }
    }
    else {
      memcpy(this->m_a + (int)uVar1,buffer,__n);
    }
    this->m_count = this->m_count + count;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }
    memcpy( (void*)(m_a + m_count), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count += count;
  }
}